

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_quic_transport.cc
# Opt level: O0

bool __thiscall
MockQuicTransport::ReadHeader
          (MockQuicTransport *this,uint8_t *out_type,ssl_encryption_level_t *out_level,
          size_t *out_len)

{
  FILE *pFVar1;
  bool bVar2;
  int iVar3;
  pointer pbVar4;
  size_t *psVar5;
  reference pvVar6;
  ulong uVar7;
  char *pcVar8;
  size_type sVar9;
  Span<unsigned_char> out;
  Span<unsigned_char> out_00;
  Span<unsigned_char> out_01;
  Span<unsigned_char> local_e8;
  allocator<unsigned_char> local_d1;
  undefined1 local_d0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> read_secret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *secret;
  Span<unsigned_char> local_a8 [2];
  allocator<unsigned_char> local_81;
  undefined1 local_80 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> discard;
  uint uStack_60;
  uint16_t expect_cipher;
  ssl_encryption_level_t level;
  uint32_t remaining_bytes;
  uint16_t cipher_suite;
  uint8_t level_id;
  CBS cbs;
  uchar *local_40;
  uchar local_38 [8];
  uint8_t header [8];
  size_t *out_len_local;
  ssl_encryption_level_t *out_level_local;
  uint8_t *out_type_local;
  MockQuicTransport *this_local;
  
  header = (uint8_t  [8])out_len;
  while( true ) {
    pbVar4 = std::unique_ptr<bio_st,_bssl::internal::Deleter>::get(&this->bio_);
    bssl::Span<unsigned_char>::Span<8ul>((Span<unsigned_char> *)&cbs.len,&local_38);
    out.size_ = (size_t)out_len;
    out.data_ = local_40;
    bVar2 = anon_unknown.dwarf_3598e::ReadAll((anon_unknown_dwarf_3598e *)pbVar4,(BIO *)cbs.len,out)
    ;
    if (!bVar2) {
      this_local._7_1_ = 0;
      goto LAB_00135595;
    }
    CBS_init((CBS *)&remaining_bytes,local_38,8);
    iVar3 = CBS_get_u8((CBS *)&remaining_bytes,out_type);
    if ((((iVar3 == 0) ||
         (iVar3 = CBS_get_u8((CBS *)&remaining_bytes,(byte *)((long)&level + 3)), iVar3 == 0)) ||
        (iVar3 = CBS_get_u16((CBS *)&remaining_bytes,(uint16_t *)&level), iVar3 == 0)) ||
       ((iVar3 = CBS_get_u32((CBS *)&remaining_bytes,&stack0xffffffffffffffa0), iVar3 == 0 ||
        (psVar5 = (size_t *)(ulong)(byte)level._3_1_,
        out_len = (size_t *)
                  std::
                  vector<MockQuicTransport::EncryptionLevel,_std::allocator<MockQuicTransport::EncryptionLevel>_>
                  ::size(&this->read_levels_), out_len <= psVar5)))) {
      fprintf(_stderr,"Error parsing record header.\n");
      this_local._7_1_ = 0;
      goto LAB_00135595;
    }
    discard.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = (ssl_encryption_level_t)(byte)level._3_1_;
    pvVar6 = std::
             vector<MockQuicTransport::EncryptionLevel,_std::allocator<MockQuicTransport::EncryptionLevel>_>
             ::operator[](&this->read_levels_,
                          (long)(int)discard.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    pFVar1 = _stderr;
    discard.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._2_2_ = pvVar6->cipher;
    if ((discard.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._2_2_ != ssl_encryption_initial) ||
       (discard.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ == ssl_encryption_initial)) break;
    if (discard.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ != ssl_encryption_early_data) {
      pcVar8 = anon_unknown.dwarf_3598e::LevelToString
                         (discard.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      fprintf(pFVar1,"Got record at level %s, but keys were not configured.\n",pcVar8);
      this_local._7_1_ = 0;
      goto LAB_00135595;
    }
    uVar7 = (ulong)uStack_60;
    std::allocator<unsigned_char>::allocator(&local_81);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80,uVar7,&local_81);
    std::allocator<unsigned_char>::~allocator(&local_81);
    pbVar4 = std::unique_ptr<bio_st,_bssl::internal::Deleter>::get(&this->bio_);
    bssl::Span<unsigned_char>::
    Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (local_a8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80);
    out_00.size_ = (size_t)out_len;
    out_00.data_ = (uchar *)local_a8[0].size_;
    bVar2 = anon_unknown.dwarf_3598e::ReadAll
                      ((anon_unknown_dwarf_3598e *)pbVar4,(BIO *)local_a8[0].data_,out_00);
    if (bVar2) {
      secret._4_4_ = 3;
    }
    else {
      this_local._7_1_ = 0;
      secret._4_4_ = 1;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80);
    if (secret._4_4_ == 1) {
LAB_00135595:
      return (bool)(this_local._7_1_ & 1);
    }
  }
  if ((undefined2)level ==
      discard.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._2_2_) {
    pvVar6 = std::
             vector<MockQuicTransport::EncryptionLevel,_std::allocator<MockQuicTransport::EncryptionLevel>_>
             ::operator[](&this->read_levels_,
                          (long)(int)discard.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    read_secret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)&pvVar6->secret;
    sVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       read_secret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::allocator<unsigned_char>::allocator(&local_d1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0,sVar9,&local_d1);
    std::allocator<unsigned_char>::~allocator(&local_d1);
    uVar7 = (ulong)uStack_60;
    sVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       read_secret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pFVar1 = _stderr;
    if (uVar7 < sVar9) {
      pcVar8 = anon_unknown.dwarf_3598e::LevelToString
                         (discard.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      fprintf(pFVar1,"Record at level %s too small.\n",pcVar8);
      this_local._7_1_ = 0;
    }
    else {
      sVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         read_secret.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
      uStack_60 = uStack_60 - (int)sVar9;
      pbVar4 = std::unique_ptr<bio_st,_bssl::internal::Deleter>::get(&this->bio_);
      bssl::Span<unsigned_char>::
      Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (&local_e8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0);
      out_01.size_ = sVar9;
      out_01.data_ = (uchar *)local_e8.size_;
      bVar2 = anon_unknown.dwarf_3598e::ReadAll
                        ((anon_unknown_dwarf_3598e *)pbVar4,(BIO *)local_e8.data_,out_01);
      if (bVar2) {
        bVar2 = std::operator!=((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0,
                                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                read_secret.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
        pFVar1 = _stderr;
        if (bVar2) {
          pcVar8 = anon_unknown.dwarf_3598e::LevelToString
                             (discard.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          fprintf(pFVar1,"Encryption secret at level %s did not match.\n",pcVar8);
          this_local._7_1_ = 0;
        }
        else {
          *out_level = discard.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          *(ulong *)header = (ulong)uStack_60;
          this_local._7_1_ = 1;
        }
      }
      else {
        fprintf(_stderr,"Error reading record secret.\n");
        this_local._7_1_ = 0;
      }
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0);
  }
  else {
    pcVar8 = anon_unknown.dwarf_3598e::LevelToString
                       (discard.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    fprintf(pFVar1,"Got cipher suite 0x%04x at level %s, wanted 0x%04x.\n",
            (ulong)(ushort)(undefined2)level,pcVar8,
            (ulong)(ushort)discard.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._2_2_);
    this_local._7_1_ = 0;
  }
  goto LAB_00135595;
}

Assistant:

bool MockQuicTransport::ReadHeader(uint8_t *out_type,
                                   enum ssl_encryption_level_t *out_level,
                                   size_t *out_len) {
  for (;;) {
    uint8_t header[8];
    if (!ReadAll(bio_.get(), header)) {
      // TODO(davidben): Distinguish between errors and EOF. See
      // ReadApplicationData.
      return false;
    }

    CBS cbs;
    uint8_t level_id;
    uint16_t cipher_suite;
    uint32_t remaining_bytes;
    CBS_init(&cbs, header, sizeof(header));
    if (!CBS_get_u8(&cbs, out_type) ||
        !CBS_get_u8(&cbs, &level_id) ||
        !CBS_get_u16(&cbs, &cipher_suite) ||
        !CBS_get_u32(&cbs, &remaining_bytes) ||
        level_id >= read_levels_.size()) {
      fprintf(stderr, "Error parsing record header.\n");
      return false;
    }

    auto level = static_cast<ssl_encryption_level_t>(level_id);
    // Non-initial levels must be configured before use.
    uint16_t expect_cipher = read_levels_[level].cipher;
    if (expect_cipher == 0 && level != ssl_encryption_initial) {
      if (level == ssl_encryption_early_data) {
        // If we receive early data records without any early data keys, skip
        // the record. This means early data was rejected.
        std::vector<uint8_t> discard(remaining_bytes);
        if (!ReadAll(bio_.get(), bssl::Span(discard))) {
          return false;
        }
        continue;
      }
      fprintf(stderr,
              "Got record at level %s, but keys were not configured.\n",
              LevelToString(level));
      return false;
    }
    if (cipher_suite != expect_cipher) {
      fprintf(stderr, "Got cipher suite 0x%04x at level %s, wanted 0x%04x.\n",
              cipher_suite, LevelToString(level), expect_cipher);
      return false;
    }
    const std::vector<uint8_t> &secret = read_levels_[level].secret;
    std::vector<uint8_t> read_secret(secret.size());
    if (remaining_bytes < secret.size()) {
      fprintf(stderr, "Record at level %s too small.\n", LevelToString(level));
      return false;
    }
    remaining_bytes -= secret.size();
    if (!ReadAll(bio_.get(), bssl::Span(read_secret))) {
      fprintf(stderr, "Error reading record secret.\n");
      return false;
    }
    if (read_secret != secret) {
      fprintf(stderr, "Encryption secret at level %s did not match.\n",
              LevelToString(level));
      return false;
    }
    *out_level = level;
    *out_len = remaining_bytes;
    return true;
  }
}